

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::ConflictPoolPropagation::ConflictPoolPropagation
          (ConflictPoolPropagation *this,HighsInt conflictpoolindex,HighsDomain *domain,
          HighsConflictPool *conflictpool_)

{
  value_type_conflict2 local_30 [2];
  
  this->conflictpoolindex = conflictpoolindex;
  this->domain = domain;
  this->conflictpool_ = conflictpool_;
  (this->colLowerWatched_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colLowerWatched_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colLowerWatched_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->colUpperWatched_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colUpperWatched_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colUpperWatched_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->conflictFlag_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->propagateConflictInds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->propagateConflictInds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->propagateConflictInds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->watchedLiterals_).
  super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->watchedLiterals_).
  super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->watchedLiterals_).
  super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30[1] = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->colLowerWatched_,(long)domain->mipsolver->model_->num_col_,local_30 + 1);
  local_30[0] = -1;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->colUpperWatched_,(long)domain->mipsolver->model_->num_col_,local_30);
  HighsConflictPool::addPropagationDomain(conflictpool_,this);
  return;
}

Assistant:

HighsDomain::ConflictPoolPropagation::ConflictPoolPropagation(
    HighsInt conflictpoolindex, HighsDomain* domain,
    HighsConflictPool& conflictpool_)
    : conflictpoolindex(conflictpoolindex),
      domain(domain),
      conflictpool_(&conflictpool_) {
  colLowerWatched_.resize(domain->mipsolver->numCol(), -1);
  colUpperWatched_.resize(domain->mipsolver->numCol(), -1);
  conflictpool_.addPropagationDomain(this);
}